

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

double computeTN93(char *s1,char *s2,unsigned_long L,char matchMode,long *randomize,long min_overlap
                  ,unsigned_long *histogram,double slice,unsigned_long hist_size,long count1,
                  long count2,sequence_gap_structure *sequence_descriptor1,
                  sequence_gap_structure *sequence_descriptor2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  char in_CL;
  long lVar7;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_R8;
  long *in_R9;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  unsigned_long *unaff_retaddr;
  unsigned_long in_stack_00000008;
  ulong in_stack_00000010;
  long in_stack_00000018;
  sequence_gap_structure *in_stack_00000020;
  sequence_gap_structure *in_stack_00000028;
  ulong *in_stack_00000030;
  long index;
  double dist;
  double pc;
  int c2_6;
  int c1_6;
  uint c2_5;
  uint c1_5;
  long pi;
  uint p_4;
  uint c2_4;
  uint c1_4;
  uint p_3;
  uint c2_3;
  uint c1_3;
  unsigned_long p_2;
  uint c2_2;
  uint c1_2;
  uint c4;
  uint c3;
  uint c2_1;
  uint c1_1;
  unsigned_long p_1;
  uint c2;
  uint c1;
  uint p;
  unsigned_long span_end;
  unsigned_long span_start;
  unsigned_long last_nongap;
  unsigned_long first_nongap;
  anon_class_32_4_32a09f7f ambiguityHandler;
  long integer_counts2 [4] [4];
  long integer_counts [4] [4];
  double float_counts [4] [4];
  double nucF [4];
  double totalNonGap;
  double tv;
  double ti;
  double CT;
  double AG;
  double K3;
  double K2;
  double K1;
  double fR;
  double fY;
  double nucFreq [4];
  double auxd;
  long aux1;
  unsigned_long ambig_count;
  bool useK2P;
  long alStack_1688 [16];
  long alStack_1608 [588];
  double local_3a8;
  undefined8 in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc92;
  bool bVar14;
  undefined1 in_stack_fffffffffffffc93;
  undefined1 in_stack_fffffffffffffc94;
  undefined1 in_stack_fffffffffffffc95;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  double local_340;
  int local_330;
  int local_32c;
  uint local_318;
  uint local_30c;
  ulong local_300;
  ulong local_2e0;
  uint local_2cc;
  long local_288 [16];
  long local_208 [16];
  double local_188 [5];
  double local_160;
  double local_150;
  double local_148;
  double local_138;
  double local_120;
  double local_110;
  double local_108 [4];
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98 [4];
  double local_78;
  long local_70;
  undefined8 local_68;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar15;
  undefined7 in_stack_ffffffffffffffc0;
  double local_20;
  
  bVar15 = 0;
  local_68 = 0;
  memset(local_98,0,0x20);
  local_e8 = 0.0;
  memset(local_188,0,0x80);
  memset(local_208,0,0x80);
  memset(local_288,0,0x80);
  if (in_R8 == 0) {
    if (((in_stack_00000028 == (sequence_gap_structure *)0x0) || (in_stack_00000030 == (ulong *)0x0)
        ) || (in_CL == '\x03')) {
      for (local_30c = 0; (char *)(ulong)local_30c < in_RDX; local_30c = local_30c + 1) {
        uVar1 = (uint)*(char *)(in_RDI + (ulong)local_30c);
        uVar2 = (uint)in_RSI[local_30c];
        bVar14 = uVar1 < 4 && uVar2 < 4;
        if (bVar14) {
          local_208[(ulong)uVar1 * 4 + (ulong)uVar2] =
               local_208[(ulong)uVar1 * 4 + (ulong)uVar2] + 1;
        }
        else if (((uVar1 != 0x11) && (uVar2 != 0x11)) ||
                ((in_CL == '\x03' && ((uVar1 != 0x11 || (uVar2 != 0x11)))))) {
          computeTN93::anon_class_32_4_32a09f7f::operator()
                    ((anon_class_32_4_32a09f7f *)
                     CONCAT17(in_stack_fffffffffffffc97,
                              CONCAT16(in_stack_fffffffffffffc96,
                                       CONCAT15(in_stack_fffffffffffffc95,
                                                CONCAT14(in_stack_fffffffffffffc94,
                                                         CONCAT13(bVar14,CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),
                     (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                     (uint)in_stack_fffffffffffffc88);
        }
      }
    }
    else {
      if ((long)*in_stack_00000030 < in_stack_00000028->first_nongap) {
        local_350 = in_stack_00000028->first_nongap;
      }
      else {
        local_350 = *in_stack_00000030;
      }
      if (in_stack_00000028->last_nongap < (long)in_stack_00000030[1]) {
        local_358 = in_stack_00000028->last_nongap;
      }
      else {
        local_358 = in_stack_00000030[1];
      }
      if ((long)in_stack_00000030[2] < in_stack_00000028->resolved_start) {
        local_360 = in_stack_00000028->resolved_start;
      }
      else {
        local_360 = in_stack_00000030[2];
      }
      if (in_stack_00000028->resolved_end < (long)in_stack_00000030[3]) {
        local_368 = in_stack_00000028->resolved_end;
      }
      else {
        local_368 = in_stack_00000030[3];
      }
      if (local_368 < local_360) {
        for (local_2cc = (uint)local_350; local_2cc <= local_358; local_2cc = local_2cc + 1) {
          uVar1 = (uint)*(char *)(in_RDI + (ulong)local_2cc);
          uVar2 = (uint)in_RSI[local_2cc];
          if ((uVar1 < 4) && (uVar2 < 4)) {
            local_208[(ulong)uVar1 * 4 + (ulong)uVar2] =
                 local_208[(ulong)uVar1 * 4 + (ulong)uVar2] + 1;
          }
          else if ((uVar1 != 0x11) && (uVar2 != 0x11)) {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      ((anon_class_32_4_32a09f7f *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(in_stack_fffffffffffffc94,
                                                           CONCAT13(in_stack_fffffffffffffc93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),
                       (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                       (uint)in_stack_fffffffffffffc88);
          }
        }
      }
      else {
        local_2e0 = local_350;
        while( true ) {
          uVar1 = (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20);
          if (local_360 < local_2e0 + 2) break;
          uVar2 = (uint)*(char *)(in_RDI + local_2e0);
          uVar3 = (uint)in_RSI[local_2e0];
          uVar4 = (uint)*(char *)(in_RDI + 1 + local_2e0);
          uVar5 = (uint)in_RSI[local_2e0 + 1];
          in_stack_fffffffffffffc97 = uVar2 < 4 && uVar3 < 4;
          if ((bool)in_stack_fffffffffffffc97) {
            local_208[(ulong)uVar2 * 4 + (ulong)uVar3] =
                 local_208[(ulong)uVar2 * 4 + (ulong)uVar3] + 1;
          }
          else if ((uVar2 != 0x11) && (uVar3 != 0x11)) {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      ((anon_class_32_4_32a09f7f *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(in_stack_fffffffffffffc94,
                                                           CONCAT13(in_stack_fffffffffffffc93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),uVar1,
                       (uint)in_stack_fffffffffffffc88);
          }
          in_stack_fffffffffffffc96 = uVar4 < 4 && uVar5 < 4;
          if ((bool)in_stack_fffffffffffffc96) {
            local_288[(ulong)uVar4 * 4 + (ulong)uVar5] =
                 local_288[(ulong)uVar4 * 4 + (ulong)uVar5] + 1;
          }
          else if ((uVar4 != 0x11) && (uVar5 != 0x11)) {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      ((anon_class_32_4_32a09f7f *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(in_stack_fffffffffffffc94,
                                                           CONCAT13(in_stack_fffffffffffffc93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),
                       (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                       (uint)in_stack_fffffffffffffc88);
          }
          local_2e0 = local_2e0 + 2;
        }
        if (local_2e0 < local_360) {
          uVar2 = (uint)*(char *)(in_RDI + local_2e0);
          uVar3 = (uint)in_RSI[local_2e0];
          in_stack_fffffffffffffc95 = uVar2 < 4 && uVar3 < 4;
          if ((bool)in_stack_fffffffffffffc95) {
            local_208[(ulong)uVar2 * 4 + (ulong)uVar3] =
                 local_208[(ulong)uVar2 * 4 + (ulong)uVar3] + 1;
          }
          else if ((uVar2 != 0x11) && (uVar3 != 0x11)) {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      ((anon_class_32_4_32a09f7f *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(in_stack_fffffffffffffc94,
                                                           CONCAT13(in_stack_fffffffffffffc93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),uVar1,
                       (uint)in_stack_fffffffffffffc88);
          }
        }
        for (local_2e0 = local_360; local_2e0 + 2 <= local_368; local_2e0 = local_2e0 + 2) {
          local_208[(long)*(char *)(in_RDI + local_2e0) * 4 + (long)in_RSI[local_2e0]] =
               local_208[(long)*(char *)(in_RDI + local_2e0) * 4 + (long)in_RSI[local_2e0]] + 1;
          lVar7 = (long)*(char *)(in_RDI + 1 + local_2e0);
          local_288[lVar7 * 4 + (long)in_RSI[local_2e0 + 1]] =
               local_288[lVar7 * 4 + (long)in_RSI[local_2e0 + 1]] + 1;
        }
        for (; local_2e0 <= local_368; local_2e0 = local_2e0 + 1) {
          local_208[(ulong)(uint)(int)*(char *)(in_RDI + local_2e0) * 4 +
                    (ulong)(uint)(int)in_RSI[local_2e0]] =
               local_208[(ulong)(uint)(int)*(char *)(in_RDI + local_2e0) * 4 +
                         (ulong)(uint)(int)in_RSI[local_2e0]] + 1;
        }
        while (local_300 = local_368 + 1, local_300 <= local_358) {
          uVar1 = (uint)*(char *)(in_RDI + local_300);
          uVar2 = (uint)in_RSI[local_300];
          bVar14 = uVar1 < 4 && uVar2 < 4;
          local_368 = local_300;
          if (bVar14) {
            local_208[(ulong)uVar1 * 4 + (ulong)uVar2] =
                 local_208[(ulong)uVar1 * 4 + (ulong)uVar2] + 1;
          }
          else if ((uVar1 != 0x11) && (uVar2 != 0x11)) {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      ((anon_class_32_4_32a09f7f *)
                       CONCAT17(in_stack_fffffffffffffc97,
                                CONCAT16(in_stack_fffffffffffffc96,
                                         CONCAT15(in_stack_fffffffffffffc95,
                                                  CONCAT14(bVar14,CONCAT13(in_stack_fffffffffffffc93
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90)))))),
                       (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                       (uint)in_stack_fffffffffffffc88);
          }
        }
      }
    }
  }
  else {
    for (local_318 = 0; (char *)(ulong)local_318 < in_RDX; local_318 = local_318 + 1) {
      lVar7 = *(long *)(in_R8 + (ulong)local_318 * 8);
      uVar1 = (uint)*(char *)(in_RDI + lVar7);
      uVar2 = (uint)in_RSI[lVar7];
      bVar14 = uVar1 < 4 && uVar2 < 4;
      if (bVar14) {
        local_208[(ulong)uVar1 * 4 + (ulong)uVar2] = local_208[(ulong)uVar1 * 4 + (ulong)uVar2] + 1;
      }
      else if (((uVar1 != 0x11) && (uVar2 != 0x11)) ||
              ((in_CL == '\x03' && ((uVar1 != 0x11 || (uVar2 != 0x11)))))) {
        computeTN93::anon_class_32_4_32a09f7f::operator()
                  ((anon_class_32_4_32a09f7f *)
                   CONCAT17(in_stack_fffffffffffffc97,
                            CONCAT16(in_stack_fffffffffffffc96,
                                     CONCAT15(in_stack_fffffffffffffc95,
                                              CONCAT14(in_stack_fffffffffffffc94,
                                                       CONCAT13(in_stack_fffffffffffffc93,
                                                                CONCAT12(bVar14,
                                                  in_stack_fffffffffffffc90)))))),
                   (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),(uint)in_stack_fffffffffffffc88)
        ;
      }
    }
  }
  for (local_32c = 0; local_32c < 4; local_32c = local_32c + 1) {
    for (local_330 = 0; local_330 < 4; local_330 = local_330 + 1) {
      dVar8 = (double)(local_208[(long)local_32c * 4 + (long)local_330] +
                      local_288[(long)local_32c * 4 + (long)local_330]) +
              local_188[(long)local_32c * 4 + (long)local_330];
      local_188[(long)local_32c * 4 + (long)local_330] = dVar8;
      local_e8 = dVar8 + local_e8;
      local_98[local_32c] = dVar8 + local_98[local_32c];
      local_98[local_330] = dVar8 + local_98[local_330];
    }
  }
  if (local_e8 <= (double)(long)in_R9) {
    local_20 = -1.0;
  }
  else if ((((in_CL != '\0') && (in_CL != '\x04')) || (1.0 <= resolve_fraction)) ||
          (auVar13._8_4_ = (int)((ulong)local_68 >> 0x20), auVar13._0_8_ = local_68,
          auVar13._12_4_ = 0x45300000,
          (auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0) <
          local_e8 * resolve_fraction)) {
    local_e8 = 2.0 / (local_98[0] + local_98[1] + local_98[2] + local_98[3]);
    local_78 = 1.0 / (local_98[0] + local_98[1] + local_98[2] + local_98[3]);
    for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
      local_108[local_70] = local_98[local_70] * local_78;
    }
    local_a8 = local_108[0] + local_108[2];
    local_a0 = local_108[1] + local_108[3];
    if (((((local_98[0] == 0.0) && (!NAN(local_98[0]))) ||
         ((local_98[1] == 0.0 && (!NAN(local_98[1]))))) ||
        ((local_98[2] == 0.0 && (!NAN(local_98[2]))))) ||
       ((local_98[3] == 0.0 && (!NAN(local_98[3]))))) {
      bVar15 = 1;
    }
    else {
      local_b0 = (local_108[0] * 2.0 * local_108[2]) / local_a8;
      local_b8 = (local_108[1] * 2.0 * local_108[3]) / local_a0;
      local_c0 = ((local_a8 * local_a0 + -((local_108[0] * local_108[2] * local_a0) / local_a8)) -
                 (local_108[1] * local_108[3] * local_a8) / local_a0) * 2.0;
    }
    dVar8 = (local_188[2] + local_148) * local_e8;
    dVar9 = (local_150 + local_120) * local_e8;
    local_e0 = 1.0 - ((local_188[0] + local_160 + local_138 + local_110) * local_e8 + dVar8 + dVar9)
    ;
    if ((bVar15 & 1) == 0) {
      local_c8 = (1.0 - dVar8 / local_b0) - (local_e0 * 0.5) / local_a8;
      local_d0 = (1.0 - dVar9 / local_b8) - (local_e0 * 0.5) / local_a0;
      local_e0 = 1.0 - ((local_e0 * 0.5) / local_a0) / local_a8;
      if (((local_c8 <= 0.0) || (local_d0 <= 0.0)) || (local_e0 <= 0.0)) {
        local_340 = 1000.0;
      }
      else {
        dVar6 = -local_b0;
        dVar10 = log(local_c8);
        dVar9 = local_b8;
        dVar11 = log(local_d0);
        dVar8 = local_c0;
        dVar12 = log(local_e0);
        local_340 = -dVar8 * dVar12 + dVar6 * dVar10 + -(dVar9 * dVar11);
      }
    }
    else {
      local_d8 = dVar8 + dVar9;
      local_c8 = (1.0 - (local_d8 + local_d8)) - local_e0;
      local_d0 = 1.0 - (local_e0 + local_e0);
      if ((local_c8 <= 0.0) || (local_d0 <= 0.0)) {
        local_340 = 1000.0;
      }
      else {
        dVar8 = log(local_c8);
        dVar9 = log(local_d0);
        local_340 = dVar8 * -0.5 + -(dVar9 * 0.25);
      }
    }
    if (in_stack_00000008 != 0) {
      dVar8 = floor(local_340 * in_XMM0_Qa);
      local_348 = (ulong)dVar8;
      if (in_stack_00000010 <= local_348) {
        local_348 = in_stack_00000010 - 1;
      }
      *(long *)(in_stack_00000008 + local_348 * 8) =
           in_stack_00000018 * (long)in_stack_00000020 +
           *(long *)(in_stack_00000008 + local_348 * 8);
    }
    if (0.0 < local_340) {
      local_3a8 = local_340;
    }
    else {
      local_3a8 = 0.0;
    }
    local_20 = local_3a8;
  }
  else {
    local_20 = computeTN93(in_RSI,in_RDX,CONCAT17(in_CL,in_stack_ffffffffffffffc0),
                           (char)((ulong)in_R8 >> 0x38),in_R9,(long)in_XMM0_Qa,unaff_retaddr,
                           (double)CONCAT17(bVar15,in_stack_ffffffffffffffa0),in_stack_00000008,
                           in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028);
  }
  return local_20;
}

Assistant:

double		computeTN93 (const char * __restrict__ s1, const char * __restrict__ s2,  const unsigned long L, const char matchMode, const long * randomize, const long min_overlap,
                       unsigned long* histogram, const double slice, const unsigned long hist_size, const long count1, const long count2, const sequence_gap_structure * sequence_descriptor1, const sequence_gap_structure * sequence_descriptor2) {
  
  bool useK2P   = false;
  unsigned long ambig_count = 0UL;
  long aux1;
    
  
  double auxd,
  nucFreq[4]		= {0.,0.,0.,0.},
  fY,
  fR,
  K1,
  K2,
  K3,
  AG,
  CT,
  ti,
  tv,
  totalNonGap	= 0.,
  nucF[4],
  float_counts [4][4] = {{0.},{0.},{0.},{0.}};
  
  long integer_counts  [4][4] = {{0L}, {0L}, {0L}, {0L}};
  long integer_counts2 [4][4] = {{0L}, {0L}, {0L}, {0L}};

  auto ambiguityHandler = [&] (unsigned c1, unsigned c2) -> void {
      if (c1 < 4UL) { // c1 resolved and c2 is not
        if (matchMode != SKIP) {
          if (resolutionsCount[c2] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c2])) {
                  if (resolutions[c2][c1]) {
                      ambig_count ++;
                      integer_counts[c1][c1] ++;
                      return;
                  }
              }
            
            if (resolutions[c2][0])
              float_counts[c1][0] += resolutionsCount[c2];
            if (resolutions[c2][1])
              float_counts[c1][1] += resolutionsCount[c2];
            if (resolutions[c2][2])
              float_counts[c1][2] += resolutionsCount[c2];
            if (resolutions[c2][3])
              float_counts[c1][3] += resolutionsCount[c2];
          }
        }
      }
      else {
        if (matchMode != SKIP) {
          if (c2 < 4UL) { // c2 resolved an c1 is not
            if (resolutionsCount[c1] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1])) {
                if (resolutions[c1][c2]) {
                  ambig_count ++;
                  integer_counts[c2][c2] ++;
                    return;
                }
              }
              
                
              if (resolutions[c1][0])
                float_counts[0][c2] += resolutionsCount[c1];
              if (resolutions[c1][1])
                float_counts[1][c2] += resolutionsCount[c1];
              if (resolutions[c1][2])
                float_counts[2][c2] += resolutionsCount[c1];
              if (resolutions[c1][3])
                float_counts[3][c2] += resolutionsCount[c1];
            }
          } else {
            // ambig and ambig
            double norm = resolutionsCount[c1] * resolutionsCount[c2];
            //cout << int(c1) << ":" << int(c2) << "/" << norm << endl;
            if (norm > 0.0) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1] && resolveTheseAmbigs[c2])) {
                ambig_count ++;
                long matched_count = 0L,
                positive_match [4] = {0,0,0,0};
                for (long i = 0; i < 4L; i ++) {
                  if (resolutions[c1][i] && resolutions[c2][i]) {
                    matched_count ++;
                    positive_match[i] = 1;
                  }
                }
                
                if (matched_count > 0L) {
                  double norm2 = 1./matched_count;
                  
                  for (long i = 0; i < 4L; i ++) {
                    if (positive_match[i]) {
                      float_counts[i][i] += norm2;
                    }
                  }
                    return;
                }
              }
              
              for (long i = 0; i < 4L; i ++) {
                if (resolutions[c1][i]) {
                  for (long j = 0; j < 4L; j ++) {
                    if (resolutions [c2][j]) {
                      float_counts[i][j] += norm;
                    }
                  }
                }
              }
            }
          }
        }
      }
  };

  if (randomize == NULL) {
    
    if (sequence_descriptor1 && sequence_descriptor2 && matchMode != GAPMM) {
      
      
//#pragma omp critical      
//      cout << "HERE" << endl;
     
      
      unsigned long first_nongap = MAX  (sequence_descriptor1->first_nongap,   sequence_descriptor2->first_nongap),
                    last_nongap  = MIN  (sequence_descriptor1->last_nongap,    sequence_descriptor2->last_nongap),
                    span_start   = MAX  (sequence_descriptor1->resolved_start, sequence_descriptor2->resolved_start),
                    span_end     = MIN  (sequence_descriptor1->resolved_end,    sequence_descriptor2->resolved_end);
//#pragma omp critical      
//      cout << first_nongap << " " << last_nongap << " " << span_start << " " << span_end << endl;
      
      
      if (span_start > span_end) {
        for (unsigned p = first_nongap; p <= last_nongap; p++) {
          unsigned c1 = s1[p],
                   c2 = s2[p];
          
          if (c1 < 4 && c2 < 4) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
      else {
        
        /*for (unsigned long p = first_nongap; p < span_start; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }*/
        unsigned long p = first_nongap;
          
        for (; p + 2 <= span_start; p+=2) {
            unsigned c1 = s1[p],   c2 = s2[p];
            unsigned c3 = s1[p+1], c4 = s2[p+1];
            
            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                ambiguityHandler (c1,c2);
              }
            }
            
            if (__builtin_expect(c3 < 4 && c4 < 4, 1)) {
              integer_counts2 [c3][c4] ++;
            } else { // not both resolved
              if (c3 != GAP && c4 != GAP) {
                ambiguityHandler (c3,c4);
              }
            }
        }
          
        if (p < span_start) {
            unsigned c1 = s1[p];
            unsigned c2 = s2[p];

            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                  ambiguityHandler (c1,c2);
              }
            }
          
        }
        
        // manual loop unroll here, use integer table counts
          
        //long equals [4] = {0L,0L,0L,0L};
          
          p  = span_start;
          for (; p + 2 <= span_end ; p+=2) {
              integer_counts  [s1[p]]   [s2[p]]   ++;
              integer_counts2 [s1[p+1]] [s2[p+1]] ++;
          }
              
          for (; p <= span_end ; p++) {
           integer_counts [(unsigned)s1[p]][(unsigned)s2[p]] ++;
         }

        /*for (unsigned long p = span_start; p <= span_end ; p++) {
            unsigned  idx1 = ((unsigned)s1[p]);
            unsigned  idx2 = ((unsigned)s2[p]);
            integer_counts [idx1][idx2] ++;
        }*/
          
        for (unsigned long p = span_end + 1UL; p <= last_nongap; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
 
          if (__builtin_expect(c1 < 4UL && c2 < 4UL,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
    } else {
        for (unsigned p = 0; p < L; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
    }
  } else {
        for (unsigned p = 0; p < L; p++) {
          long pi = randomize[p];
          unsigned c1 = s1[pi], c2 = s2[pi];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
  }
  
  
  //printf ("\n");
  for (int c1 = 0; c1 < 4; c1++) {
    //printf ("\n");
    for (int c2 = 0; c2 < 4; c2++) {
      double pc = (float_counts[c1][c2] += (double)(integer_counts[c1][c2] + integer_counts2[c1][c2]));
      //printf ("%12.2g\t", pc);
      totalNonGap   += pc;
      nucFreq [c1]  += pc;
      nucFreq [c2]  += pc;
    }
  }
  //printf ("\ntotalNonGap = %g\n", totalNonGap);

  if (totalNonGap <= min_overlap) {
    return -1.;
  }
  
  if ((matchMode == RESOLVE || matchMode == SUBSET) && resolve_fraction < 1. && totalNonGap * resolve_fraction <= ambig_count) {
    //cout << ambig_count << "/" << totalNonGap << endl;
    return computeTN93 (s1, s2,  L, AVERAGE , randomize, min_overlap,
                       histogram, slice, hist_size, count1, count2);
  }
  
  totalNonGap = 2./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  
  auxd = 1./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  for (aux1 = 0; aux1 < 4; aux1++)
    nucF[aux1] = nucFreq[aux1]*auxd;
  
  fR = nucF[0]+nucF[2];
  fY = nucF[1]+nucF[3];
  
  if (nucFreq[0] == 0 || nucFreq[1] == 0 || nucFreq[2] == 0 || nucFreq[3] == 0) {
      useK2P = true;
  } else {
    K1 = 2.*nucF[0]*nucF[2]/fR;
    K2 = 2.*nucF[1]*nucF[3]/fY;
    K3 = 2.*(fR*fY - nucF[0]*nucF[2]*fY/fR - nucF[1]*nucF[3]*fR/fY);
  }
  
  AG = (float_counts[0][2] + float_counts[2][0] )*totalNonGap;
  CT = (float_counts[1][3] + float_counts[3][1])*totalNonGap;
  tv = 1.-((float_counts[0][0] + float_counts[1][1] + float_counts[2][2] + float_counts[3][3])*totalNonGap +
           AG+CT);
  
  
  double dist;
  
  
  if (useK2P) {
    ti = AG+CT;
    AG = 1.-2.*ti-tv;
    CT = 1.-2.*tv;
    if (AG > 0. && CT > 0.)
      dist = -0.5*log(AG)-0.25*log(CT);
    else  
      dist = TN93_MAX_DIST;
  } else {
    AG	= 1.-AG/K1 - 0.5*tv/fR;
    CT	= 1.-CT/K2 - 0.5*tv/fY;
    tv  = 1.-0.5 * tv/fY/fR;
    if (AG > 0. && CT > 0. && tv > 0)
      dist = - K1*log(AG) - K2*log(CT) - K3*log (tv);
    else
      dist = TN93_MAX_DIST;
  }
  
  if (histogram) {
    long index = floor(dist * slice);
    if (index >= hist_size) {
      index = hist_size - 1;
    }
    histogram[index] += count1 * count2;
  }
  
  return dist <= 0. ? 0. : dist; // this is to avoid returning -0
}